

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O3

int run_test_udp_no_autobind(void)

{
  int iVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  uv_udp_t h2;
  uv_udp_t h;
  undefined1 auStack_1b8 [216];
  undefined1 local_e0 [216];
  
  puVar5 = auStack_1b8;
  puVar8 = auStack_1b8;
  puVar6 = auStack_1b8;
  puVar9 = auStack_1b8;
  puVar7 = auStack_1b8;
  puVar2 = (undefined1 *)uv_default_loop();
  puVar4 = puVar2;
  iVar1 = uv_udp_init(puVar2,local_e0);
  if (iVar1 == 0) {
    puVar4 = local_e0;
    iVar1 = uv_udp_set_multicast_ttl(puVar4,0x20);
    if (iVar1 != -9) goto LAB_0018a428;
    puVar4 = local_e0;
    iVar1 = uv_udp_set_broadcast(puVar4,1);
    if (iVar1 != -9) goto LAB_0018a42d;
    puVar4 = local_e0;
    iVar1 = uv_udp_set_ttl(puVar4,1);
    if (iVar1 != -9) goto LAB_0018a432;
    puVar4 = local_e0;
    iVar1 = uv_udp_set_multicast_loop(puVar4,1);
    if (iVar1 != -9) goto LAB_0018a437;
    puVar4 = local_e0;
    iVar1 = uv_udp_set_multicast_interface(puVar4,"0.0.0.0");
    if (iVar1 != -9) goto LAB_0018a43c;
    uv_close(local_e0,0);
    puVar4 = puVar2;
    iVar1 = uv_udp_init_ex(puVar2,auStack_1b8,0x102);
    if (iVar1 != 0) goto LAB_0018a441;
    iVar1 = uv_udp_set_multicast_ttl(auStack_1b8,0x20);
    puVar4 = puVar5;
    if (iVar1 != 0) goto LAB_0018a446;
    iVar1 = uv_udp_set_broadcast(auStack_1b8,1);
    if (iVar1 != 0) goto LAB_0018a44b;
    iVar1 = uv_udp_set_ttl(auStack_1b8,1);
    puVar8 = puVar6;
    if (iVar1 != 0) goto LAB_0018a450;
    iVar1 = uv_udp_set_multicast_loop(auStack_1b8,1);
    if (iVar1 != 0) goto LAB_0018a455;
    iVar1 = uv_udp_set_multicast_interface(auStack_1b8,"0.0.0.0");
    puVar9 = puVar7;
    if (iVar1 != 0) goto LAB_0018a45a;
    uv_close(auStack_1b8,0);
    iVar1 = uv_run(puVar2,0);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar2 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018a464;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_0018a428:
    run_test_udp_no_autobind_cold_2();
LAB_0018a42d:
    run_test_udp_no_autobind_cold_3();
LAB_0018a432:
    run_test_udp_no_autobind_cold_4();
LAB_0018a437:
    run_test_udp_no_autobind_cold_5();
LAB_0018a43c:
    run_test_udp_no_autobind_cold_6();
LAB_0018a441:
    run_test_udp_no_autobind_cold_7();
LAB_0018a446:
    puVar8 = puVar4;
    run_test_udp_no_autobind_cold_8();
LAB_0018a44b:
    run_test_udp_no_autobind_cold_9();
LAB_0018a450:
    puVar9 = puVar8;
    run_test_udp_no_autobind_cold_10();
LAB_0018a455:
    run_test_udp_no_autobind_cold_11();
LAB_0018a45a:
    puVar2 = puVar9;
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_0018a464:
  run_test_udp_no_autobind_cold_14();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_no_autobind) {
  uv_loop_t* loop;
  uv_udp_t h;
  uv_udp_t h2;

  loop = uv_default_loop();

  /* Test a lazy initialized socket. */
  ASSERT(0 == uv_udp_init(loop, &h));
  ASSERT(UV_EBADF == uv_udp_set_multicast_ttl(&h, 32));
  ASSERT(UV_EBADF == uv_udp_set_broadcast(&h, 1));
#if defined(__MVS__)
  ASSERT(UV_ENOTSUP == uv_udp_set_ttl(&h, 1));
#else
  ASSERT(UV_EBADF == uv_udp_set_ttl(&h, 1));
#endif
  ASSERT(UV_EBADF == uv_udp_set_multicast_loop(&h, 1));
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  ASSERT(UV_EBADF == uv_udp_set_multicast_interface(&h, "0.0.0.0"));

  uv_close((uv_handle_t*) &h, NULL);

  /* Test a non-lazily initialized socket. */
  ASSERT(0 == uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG));
  ASSERT(0 == uv_udp_set_multicast_ttl(&h2, 32));
  ASSERT(0 == uv_udp_set_broadcast(&h2, 1));

#if defined(__MVS__)
  /* zOS only supports setting ttl for IPv6 sockets. */
  ASSERT(UV_ENOTSUP == uv_udp_set_ttl(&h2, 1));
#else
  ASSERT(0 == uv_udp_set_ttl(&h2, 1));
#endif

  ASSERT(0 == uv_udp_set_multicast_loop(&h2, 1));
  ASSERT(0 == uv_udp_set_multicast_interface(&h2, "0.0.0.0"));

  uv_close((uv_handle_t*) &h2, NULL);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}